

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testloop.cpp
# Opt level: O2

void init_windows(testloop_handlers *handlers)

{
  Am_Drawonable *pAVar1;
  Am_Time aAStack_48 [8];
  Am_Style local_40 [8];
  Am_Style local_38 [8];
  Am_Style local_30 [8];
  
  pAVar1 = (Am_Drawonable *)Am_Drawonable::Get_Root_Drawonable((char *)0x0);
  root = pAVar1;
  Am_Style::Am_Style(local_30,(Am_Style *)&Am_No_Style);
  d1 = (Am_Drawonable *)
       (*(code *)**(undefined8 **)pAVar1)
                 (pAVar1,0x352,0xb4,0xdc,0xb4,"D1","",1,0,local_30,0,1,1,0,0,1,0,0,1,0);
  Am_Style::~Am_Style(local_30);
  pAVar1 = d1;
  Am_Style::Am_Style(local_38,(Am_Style *)&Am_No_Style);
  d2 = (Am_Drawonable *)
       (*(code *)**(undefined8 **)pAVar1)
                 (pAVar1,0xfffffffffffffff1,100,0xaf,100,"D2","D2 Icon",1,0,local_38,0,1,1,0,0,1,0,0
                  ,1,0);
  Am_Style::~Am_Style(local_38);
  pAVar1 = d2;
  Am_Style::Am_Style(local_40,(Am_Style *)&Am_No_Style);
  d3 = (Am_Drawonable *)
       (*(code *)**(undefined8 **)pAVar1)
                 (pAVar1,0x1e,0x12,0x96,100,"D3","",1,0,local_40,0,1,1,0,0,1,0,0,1,0);
  Am_Style::~Am_Style(local_40);
  (**(code **)(*(long *)d1 + 0x1b0))(d1,handlers);
  (**(code **)(*(long *)d2 + 0x1b0))(d2,handlers);
  (**(code **)(*(long *)d3 + 0x1b0))();
  (**(code **)(*(long *)d1 + 0xa0))();
  Am_Time::Am_Time(aAStack_48,0);
  Am_Drawonable::Process_Event(aAStack_48);
  Am_Time::~Am_Time(aAStack_48);
  return;
}

Assistant:

void
init_windows(testloop_handlers &handlers)
{

  // Am_Debug_Print_Input_Events = 1;

  root = Am_Drawonable::Get_Root_Drawonable();
  d1 = root->Create(TESTLOOP_D1_LEFT, 180, 220, 180, "D1");
  d2 = d1->Create(-15, 100, 175, 100, "D2", "D2 Icon", true, false, Am_No_Style,
                  false, 1, 1, 0, 0,
                  // want a title-bar when placed at top-level
                  true);
  d3 = d2->Create(30, 18, 150, 100, "D3");

  d1->Set_Input_Dispatch_Functions(&handlers);
  d2->Set_Input_Dispatch_Functions(&handlers);
  d3->Set_Input_Dispatch_Functions(&handlers);

  d1->Flush_Output();
  d1->Process_Event(0UL);
}